

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::String::FormatByte_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uchar value)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  uchar value_local;
  stringstream local_198 [8];
  stringstream ss;
  undefined1 local_188 [376];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_198);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(local_188,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::uppercase);
  std::ostream::operator<<(pvVar4,(uint)(byte)this);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string String::FormatByte(unsigned char value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << std::hex << std::uppercase
     << static_cast<unsigned int>(value);
  return ss.str();
}